

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

bool MeCab::Dictionary::assignUserDictionaryCosts
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  pointer pbVar1;
  bool bVar2;
  int factor;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  long *plVar8;
  size_t sVar9;
  size_t sVar10;
  int __oflag;
  int extraout_EDX;
  int extraout_EDX_00;
  char *str;
  ulong uVar11;
  die local_e89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e88;
  scoped_fixed_array<char,_8192> line;
  Iconv config_iconv;
  string rfeature;
  string lfeature;
  string ufeature;
  string w;
  string from;
  string dicdir;
  string config_charset;
  string right_id_file;
  string left_id_file;
  string feature;
  string rewrite_file;
  string matrix_bin_file;
  string matrix_file;
  char *col [8];
  ifstream ifs;
  byte abStack_c40 [488];
  ContextID cid;
  DictionaryRewriter rewriter;
  Connector matrix;
  ofstream ofs;
  byte abStack_760 [480];
  CharProperty property;
  DecoderFeatureIndex fi;
  
  local_e88 = dics;
  Connector::Connector(&matrix);
  rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header;
  rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  rewriter.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rewriter.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rewriter.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rewriter.left_rewrite_.super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
  .super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rewriter.left_rewrite_.super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
  .super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rewriter.left_rewrite_.super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
  .super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rewriter.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rewriter.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rewriter.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       rewriter.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  DecoderFeatureIndex::DecoderFeatureIndex(&fi);
  cid.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cid.left_._M_t._M_impl.super__Rb_tree_header._M_header;
  cid.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cid.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cid.left_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cid.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cid.right_._M_t._M_impl.super__Rb_tree_header._M_header;
  cid.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cid.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cid.right_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cid.left_bos_._M_dataplus._M_p = (pointer)&cid.left_bos_.field_2;
  cid.left_bos_._M_string_length = 0;
  cid.left_bos_.field_2._M_local_buf[0] = '\0';
  cid.right_bos_._M_dataplus._M_p = (pointer)&cid.right_bos_.field_2;
  cid.right_bos_._M_string_length = 0;
  cid.right_bos_.field_2._M_local_buf[0] = '\0';
  cid.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cid.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cid.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cid.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CharProperty::CharProperty(&property);
  Param::get<std::__cxx11::string>(&dicdir,param,"dicdir");
  std::__cxx11::string::string((string *)&ifs,"matrix.def",(allocator *)&ofs);
  create_filename(&matrix_file,&dicdir,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&ifs,"matrix.bin",(allocator *)&ofs);
  create_filename(&matrix_bin_file,&dicdir,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&ifs,"left-id.def",(allocator *)&ofs);
  create_filename(&left_id_file,&dicdir,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&ifs,"right-id.def",(allocator *)&ofs);
  create_filename(&right_id_file,&dicdir,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&ifs,"rewrite.def",(allocator *)&ofs);
  create_filename(&rewrite_file,&dicdir,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  Param::get<std::__cxx11::string>(&from,param,"dictionary-charset");
  factor = Param::get<int>(param,"cost-factor");
  if (factor < 1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9b);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"factor > 0");
    poVar7 = std::operator<<(poVar7,"] ");
    std::operator<<(poVar7,"cost factor needs to be positive value");
    die::~die((die *)&ifs);
  }
  Param::get<std::__cxx11::string>(&config_charset,param,"config-charset");
  if (config_charset._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&config_charset);
  }
  if (from._M_string_length == 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa2);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"!from.empty()");
    poVar7 = std::operator<<(poVar7,"] ");
    std::operator<<(poVar7,"input dictionary charset is empty");
    die::~die((die *)&ifs);
  }
  Iconv::Iconv(&config_iconv);
  iVar3 = Iconv::open(&config_iconv,config_charset._M_dataplus._M_p,(int)from._M_dataplus._M_p);
  if ((char)iVar3 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa5);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"config_iconv.open(config_charset.c_str(), from.c_str())");
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"iconv_open() failed with from=");
    poVar7 = std::operator<<(poVar7,(string *)&config_charset);
    poVar7 = std::operator<<(poVar7," to=");
    std::operator<<(poVar7,(string *)&from);
    die::~die((die *)&ifs);
  }
  DictionaryRewriter::open(&rewriter,rewrite_file._M_dataplus._M_p,(int)&config_iconv);
  iVar4 = DecoderFeatureIndex::open(&fi,(char *)param,__oflag);
  iVar3 = extraout_EDX;
  if ((char)iVar4 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa9);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"fi.open(param)");
    poVar7 = std::operator<<(poVar7,"] ");
    std::operator<<(poVar7,"cannot open feature index");
    die::~die((die *)&ifs);
    iVar3 = extraout_EDX_00;
  }
  iVar3 = CharProperty::open(&property,(char *)param,iVar3);
  if ((char)iVar3 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xab);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"property.open(param)");
    std::operator<<(poVar7,"] ");
    die::~die((die *)&ifs);
  }
  CharProperty::set_charset(&property,from._M_dataplus._M_p);
  bVar2 = Connector::openText(&matrix,matrix_file._M_dataplus._M_p);
  if (!bVar2) {
    iVar3 = Connector::open(&matrix,matrix_bin_file._M_dataplus._M_p,0x183d26);
    if ((char)iVar3 == '\0') {
      matrix.lsize_ = 1;
      matrix.rsize_ = 1;
    }
  }
  ContextID::open(&cid,left_id_file._M_dataplus._M_p,(int)right_id_file._M_dataplus._M_p,
                  &config_iconv);
  if ((cid.left_._M_t._M_impl.super__Rb_tree_header._M_node_count != matrix.lsize_) ||
     (cid.right_._M_t._M_impl.super__Rb_tree_header._M_node_count != matrix.rsize_)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb7);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,
                             "cid.left_size() == matrix.left_size() && cid.right_size() == matrix.right_size()"
                            );
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"Context ID files(");
    poVar7 = std::operator<<(poVar7,(string *)&left_id_file);
    poVar7 = std::operator<<(poVar7," or ");
    poVar7 = std::operator<<(poVar7,(string *)&right_id_file);
    poVar7 = std::operator<<(poVar7," may be broken: ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    die::~die((die *)&ifs);
  }
  std::ofstream::ofstream(&ofs,output,_S_out);
  if ((abStack_760[*(long *)(_ofs + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc0);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"ofs");
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"permission denied: ");
    std::operator<<(poVar7,output);
    die::~die((die *)&ifs);
  }
  for (uVar11 = 0;
      pbVar1 = (local_e88->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(local_e88->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar11 = uVar11 + 1) {
    std::ifstream::ifstream(&ifs,pbVar1[uVar11]._M_dataplus._M_p,_S_in);
    if ((abStack_c40[*(long *)(_ifs + -0x18)] & 5) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc4);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"ifs");
      poVar7 = std::operator<<(poVar7,"] ");
      poVar7 = std::operator<<(poVar7,"no such file or directory: ");
      std::operator<<(poVar7,(string *)
                             ((local_e88->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar11));
      die::~die((die *)col);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"reading ");
    poVar7 = std::operator<<(poVar7,(string *)
                                    ((local_e88->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar11));
    std::operator<<(poVar7," ... ");
    line._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
    line.ptr_ = (char *)operator_new__(0x2000);
    line.size_ = 0x2000;
    while( true ) {
      plVar8 = (long *)std::istream::getline((char *)&ifs,(long)line.ptr_);
      str = line.ptr_;
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) break;
      if (line.ptr_ == (char *)0x0) {
        str = (char *)0x0;
      }
      else {
        sVar9 = strlen(line.ptr_);
        if ((sVar9 != 0) && (str[sVar9 - 1] == '\r')) {
          str[sVar9 - 1] = '\0';
          str = line.ptr_;
        }
      }
      sVar10 = tokenizeCSV<char**>(str,col,5);
      if (sVar10 != 5) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xd8);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"n == 5");
        poVar7 = std::operator<<(poVar7,"] ");
        poVar7 = std::operator<<(poVar7,"format error: ");
        std::operator<<(poVar7,line.ptr_);
        die::~die((die *)&w);
      }
      std::__cxx11::string::string((string *)&w,col[0],(allocator *)&feature);
      std::__cxx11::string::string((string *)&feature,col[4],(allocator *)&ufeature);
      iVar3 = anon_unknown_0::calcCost(&w,&feature,factor,&fi,&rewriter,&property);
      ufeature._M_dataplus._M_p = (pointer)&ufeature.field_2;
      ufeature._M_string_length = 0;
      lfeature._M_dataplus._M_p = (pointer)&lfeature.field_2;
      lfeature._M_string_length = 0;
      ufeature.field_2._M_local_buf[0] = '\0';
      lfeature.field_2._M_local_buf[0] = '\0';
      rfeature._M_dataplus._M_p = (pointer)&rfeature.field_2;
      rfeature._M_string_length = 0;
      rfeature.field_2._M_local_buf[0] = '\0';
      bVar2 = DictionaryRewriter::rewrite(&rewriter,&feature,&ufeature,&lfeature,&rfeature);
      if (!bVar2) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xde);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature)"
                                );
        poVar7 = std::operator<<(poVar7,"] ");
        poVar7 = std::operator<<(poVar7,"rewrite failed: ");
        std::operator<<(poVar7,(string *)&feature);
        die::~die(&local_e89);
      }
      uVar5 = ContextID::lid(&cid,lfeature._M_dataplus._M_p);
      uVar6 = ContextID::rid(&cid,rfeature._M_dataplus._M_p);
      if ((((int)(uVar6 | uVar5) < 0) || ((uint)matrix._32_4_ >> 0x10 <= uVar5)) ||
         ((matrix._32_4_ & 0xffff) <= uVar6)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xe2);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)");
        poVar7 = std::operator<<(poVar7,"] ");
        poVar7 = std::operator<<(poVar7,"invalid ids are found lid=");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
        poVar7 = std::operator<<(poVar7," rid=");
        std::ostream::operator<<(poVar7,uVar6);
        die::~die(&local_e89);
      }
      escape_csv_element(&w);
      poVar7 = std::operator<<((ostream *)&ofs,(string *)&w);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,(string *)&feature);
      std::operator<<(poVar7,'\n');
      std::__cxx11::string::~string((string *)&rfeature);
      std::__cxx11::string::~string((string *)&lfeature);
      std::__cxx11::string::~string((string *)&ufeature);
      std::__cxx11::string::~string((string *)&feature);
      std::__cxx11::string::~string((string *)&w);
    }
    scoped_fixed_array<char,_8192>::~scoped_fixed_array(&line);
    std::ifstream::~ifstream(&ifs);
  }
  std::ofstream::~ofstream(&ofs);
  Iconv::~Iconv(&config_iconv);
  std::__cxx11::string::~string((string *)&config_charset);
  std::__cxx11::string::~string((string *)&from);
  std::__cxx11::string::~string((string *)&rewrite_file);
  std::__cxx11::string::~string((string *)&right_id_file);
  std::__cxx11::string::~string((string *)&left_id_file);
  std::__cxx11::string::~string((string *)&matrix_bin_file);
  std::__cxx11::string::~string((string *)&matrix_file);
  std::__cxx11::string::~string((string *)&dicdir);
  CharProperty::~CharProperty(&property);
  ContextID::~ContextID(&cid);
  DecoderFeatureIndex::~DecoderFeatureIndex(&fi);
  DictionaryRewriter::~DictionaryRewriter(&rewriter);
  Connector::~Connector(&matrix);
  return true;
}

Assistant:

bool Dictionary::assignUserDictionaryCosts(
    const Param &param,
    const std::vector<std::string> &dics,
    const char *output) {
  Connector matrix;
  DictionaryRewriter rewriter;
  DecoderFeatureIndex fi;
  ContextID cid;
  CharProperty property;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);

  const std::string from = param.get<std::string>("dictionary-charset");

  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  rewriter.open(rewrite_file.c_str(), &config_iconv);
  CHECK_DIE(fi.open(param)) << "cannot open feature index";

  CHECK_DIE(property.open(param));
  property.set_charset(from.c_str());

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  cid.open(left_id_file.c_str(),
           right_id_file.c_str(), &config_iconv);
  CHECK_DIE(cid.left_size()  == matrix.left_size() &&
            cid.right_size() == matrix.right_size())
      << "Context ID files("
      << left_id_file
      << " or "
      << right_id_file << " may be broken: "
      << cid.left_size() << " " << matrix.left_size() << " "
      << cid.right_size() << " " << matrix.right_size();

  std::ofstream ofs(output);
  CHECK_DIE(ofs) << "permission denied: " << output;

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
    std::cout << "reading " << dics[i] << " ... ";
    scoped_fixed_array<char, BUF_SIZE> line;
    while (ifs.getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
	/* if there is CR code, it should be removed */
	char *tmpstr = line.get();
	if(tmpstr != NULL){
	  size_t tmplen = strlen(tmpstr);
	  if(tmplen > 0){
	    if(tmpstr[tmplen-1] == '\r'){
	      tmpstr[tmplen-1] = '\0';
	    }
	  }
	}
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();
      std::string w = col[0];
      const std::string feature = col[4];
      const int cost = calcCost(w, feature, factor,
                                &fi, &rewriter, &property);
      std::string ufeature, lfeature, rfeature;
      CHECK_DIE(rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature))
          << "rewrite failed: " << feature;
      const int lid = cid.lid(lfeature.c_str());
      const int rid = cid.rid(rfeature.c_str());
      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;
      escape_csv_element(&w);
      ofs << w << ',' << lid << ',' << rid << ','
          << cost << ',' << feature << '\n';
    }
  }

  return true;
}